

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsSolveSatResub
              (Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int fOnlyRemove,int fSkipUpdate)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  lit lVar10;
  Abc_Obj_t *pAVar11;
  abctime aVar12;
  Hop_Obj_t *pHVar13;
  abctime aVar14;
  void *pvVar15;
  float fVar16;
  int local_d8;
  Abc_Obj_t *pDiv;
  Hop_Obj_t *pFunc;
  Abc_Obj_t *pFanin;
  abctime clk;
  int w;
  int nWords;
  int nCands;
  int i;
  int iVar;
  int RetValue;
  int pCands [12];
  uint *pData;
  int fVeryVerbose;
  int fSkipUpdate_local;
  int fOnlyRemove_local;
  int iFanin_local;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                  ,0xae,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)");
  }
  p->nTryRemoves = p->nTryRemoves + 1;
  Vec_PtrFillSimInfo(p->vDivCexes,0,p->nDivWords);
  p->nCexes = 0;
  if (p->pPars->fVeryVerbose != 0) {
    uVar1 = pNode->Id;
    uVar2 = *(uint *)&pNode->field_0x14;
    uVar3 = Vec_PtrSize(p->vSupp);
    uVar4 = Vec_PtrSize(p->vNodes);
    iVar5 = Vec_PtrSize(p->vDivs);
    iVar6 = Abc_ObjFaninNum(pNode);
    iVar7 = Abc_ObjFaninId(pNode,iFanin);
    iVar8 = Abc_ObjFaninNum(pNode);
    pAVar11 = Abc_ObjFanin(pNode,iFanin);
    iVar9 = Abc_ObjFanoutNum(pAVar11);
    if (iVar9 == 1) {
      pAVar11 = Abc_ObjFanin(pNode,iFanin);
      local_d8 = Abc_NodeMffcLabel(pAVar11,(Vec_Ptr_t *)0x0);
    }
    else {
      local_d8 = 0;
    }
    printf("%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n",
           (ulong)uVar1,(ulong)(uVar2 >> 0xc),(ulong)uVar3,(ulong)uVar4,(ulong)(uint)(iVar5 - iVar6)
           ,iVar7,iFanin,iVar8,local_d8);
  }
  w = 0;
  Vec_PtrClear(p->vMfsFanins);
  for (nWords = 0; iVar5 = Abc_ObjFaninNum(pNode), nWords < iVar5; nWords = nWords + 1) {
    pAVar11 = Abc_ObjFanin(pNode,nWords);
    if (nWords != iFanin) {
      Vec_PtrPush(p->vMfsFanins,pAVar11);
      iVar5 = Vec_PtrSize(p->vDivs);
      iVar6 = Abc_ObjFaninNum(pNode);
      iVar5 = Vec_IntEntry(p->vProjVarsSat,(iVar5 - iVar6) + nWords);
      lVar10 = toLitCond(iVar5,1);
      (&iVar)[w] = lVar10;
      w = w + 1;
    }
  }
  iVar5 = Abc_NtkMfsTryResubOnce(p,&iVar,w);
  if (iVar5 == -1) {
    p_local._4_4_ = 0;
  }
  else if (iVar5 == 1) {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %d: Fanin %d can be removed.\n",(ulong)(uint)pNode->Id,(ulong)(uint)iFanin);
    }
    p->nNodesResub = p->nNodesResub + 1;
    p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
    if (fSkipUpdate == 0) {
      aVar12 = Abc_Clock();
      pHVar13 = Abc_NtkMfsInterplate(p,&iVar,w);
      if (pHVar13 == (Hop_Obj_t *)0x0) {
        p_local._4_4_ = 0;
      }
      else {
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
        aVar14 = Abc_Clock();
        p->timeInt = (aVar14 - aVar12) + p->timeInt;
        p->nRemoves = p->nRemoves + 1;
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else if ((fOnlyRemove == 0) && (p->pPars->fRrOnly == 0)) {
    p->nTryResubs = p->nTryResubs + 1;
    do {
      iVar5 = Abc_BitWordNum(p->nCexes);
      if (p->nDivWords < iVar5) {
        __assert_fail("nWords <= p->nDivWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                      ,0x100,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)")
        ;
      }
      nCands = 0;
      while( true ) {
        iVar6 = Vec_PtrSize(p->vDivs);
        iVar7 = Abc_ObjFaninNum(pNode);
        if (iVar6 - iVar7 <= nCands) break;
        if (p->pPars->fPower == 0) {
LAB_005cfdb8:
          pvVar15 = Vec_PtrEntry(p->vDivCexes,nCands);
          clk._0_4_ = 0;
          while (((int)clk < iVar5 && (*(int *)((long)pvVar15 + (long)(int)clk * 4) == -1))) {
            clk._0_4_ = (int)clk + 1;
          }
          if ((int)clk == iVar5) break;
        }
        else {
          pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,nCands);
          fVar16 = Abc_MfsObjProb(p,pAVar11);
          if (fVar16 < 0.15) goto LAB_005cfdb8;
        }
        nCands = nCands + 1;
      }
      iVar5 = Vec_PtrSize(p->vDivs);
      iVar6 = Abc_ObjFaninNum(pNode);
      if (nCands == iVar5 - iVar6) {
        return 0;
      }
      iVar5 = Vec_IntEntry(p->vProjVarsSat,nCands);
      lVar10 = toLitCond(iVar5,1);
      (&iVar)[w] = lVar10;
      iVar5 = Abc_NtkMfsTryResubOnce(p,&iVar,w + 1);
      if (iVar5 == -1) {
        return 0;
      }
      if (iVar5 == 1) {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Node %d: Fanin %d can be replaced by divisor %d.\n",(ulong)(uint)pNode->Id,
                 (ulong)(uint)iFanin,(ulong)(uint)nCands);
        }
        p->nNodesResub = p->nNodesResub + 1;
        p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
        if (fSkipUpdate != 0) {
          return 1;
        }
        aVar12 = Abc_Clock();
        pHVar13 = Abc_NtkMfsInterplate(p,&iVar,w + 1);
        if (pHVar13 == (Hop_Obj_t *)0x0) {
          return 0;
        }
        p_00 = p->vMfsFanins;
        pvVar15 = Vec_PtrEntry(p->vDivs,nCands);
        Vec_PtrPush(p_00,pvVar15);
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
        aVar14 = Abc_Clock();
        p->timeInt = (aVar14 - aVar12) + p->timeInt;
        p->nResubs = p->nResubs + 1;
        return 1;
      }
    } while (p->nCexes < p->pPars->nWinMax);
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %d: Cannot find replacement for fanin %d.\n",(ulong)(uint)pNode->Id,
             (ulong)(uint)iFanin);
    }
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsSolveSatResub( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int fOnlyRemove, int fSkipUpdate )
{
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 200;// || pNode->Id == 556;
    unsigned * pData;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, i, nCands, nWords, w;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    p->nTryRemoves++;

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( p->pPars->fVeryVerbose )
    {
//        printf( "\n" );
        printf( "%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            Abc_ObjFaninId(pNode, iFanin), iFanin, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin), NULL) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Node %d: Fanin %d can be removed.\n", pNode->Id, iFanin );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
        if ( fSkipUpdate )
            return 1;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        p->nRemoves++;
        return 1;
    }

    if ( fOnlyRemove || p->pPars->fRrOnly )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = -1;
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        for ( iVar = 0; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.15 )
                    continue;
            }
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
            for ( w = 0; w < nWords; w++ )
                if ( pData[w] != ~0 )
                    break;
            if ( w == nWords )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+1 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Node %d: Fanin %d can be replaced by divisor %d.\n", pNode->Id, iFanin, iVar );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
            if ( fSkipUpdate )
                return 1;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+1 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            p->nResubs++;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    if ( p->pPars->fVeryVerbose )
        printf( "Node %d: Cannot find replacement for fanin %d.\n", pNode->Id, iFanin );
    return 0;
}